

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGenGlobalInitializer.cxx
# Opt level: O0

bool __thiscall cmQtAutoGenGlobalInitializer::generate(cmQtAutoGenGlobalInitializer *this)

{
  bool bVar1;
  undefined1 local_11;
  cmQtAutoGenGlobalInitializer *this_local;
  
  bVar1 = InitializeCustomTargets(this);
  local_11 = false;
  if (bVar1) {
    local_11 = SetupCustomTargets(this);
  }
  return local_11;
}

Assistant:

bool cmQtAutoGenGlobalInitializer::generate()
{
  return (InitializeCustomTargets() && SetupCustomTargets());
}